

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::UniformCase::assignUniforms
          (UniformCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL,Random *rnd)

{
  CallLogWrapper *this_00;
  pointer str;
  uint uVar1;
  TestLog *pTVar2;
  pointer pBVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  pointer pVVar7;
  DataType scalarType;
  GLint location;
  int iVar8;
  uint uVar9;
  DataType DVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  deUint32 dVar14;
  GLenum GVar15;
  long lVar16;
  const_iterator cVar17;
  VarValue *pVVar18;
  char *pcVar19;
  long lVar20;
  bool bVar21;
  uint uVar22;
  int iVar23;
  undefined8 extraout_RDX;
  undefined8 uVar24;
  VarValue *value;
  VarValue *value_00;
  undefined8 extraout_RDX_00;
  ulong uVar25;
  int iVar26;
  DataType *pDVar27;
  ulong uVar28;
  ostringstream *poVar29;
  VarValue *pVVar30;
  long lVar31;
  GLsizei GVar32;
  uint uVar33;
  byte bVar34;
  float fVar35;
  GLboolean local_328;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
  valuesToAssign;
  VarValue apiValue;
  undefined1 local_2a0 [72];
  string curName;
  string local_238;
  string queryName;
  VarValue result_2;
  VarValue local_78;
  
  bVar34 = 0;
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  uVar1 = *(uint *)&(this->super_CallLogWrapper).field_0x14;
  DVar10 = TYPE_UINT;
  if (-1 < (char)uVar1) {
    DVar10 = TYPE_FLOAT;
  }
  scalarType = TYPE_INT;
  if ((uVar1 & 0x40) == 0) {
    scalarType = DVar10;
  }
  this_00 = &this->super_CallLogWrapper;
  lVar31 = 0;
  do {
    pBVar3 = (basicUniforms->
             super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar16 = (long)(basicUniforms->
                   super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3;
    if ((int)(lVar16 / 0x98) <= lVar31) {
      return;
    }
    str = pBVar3 + lVar31;
    iVar23 = pBVar3[lVar31].elemNdx;
    if ((((this->super_CallLogWrapper).field_0x15 & 1) == 0) || (iVar23 != 0)) {
      std::__cxx11::string::string((string *)&queryName,(string *)str);
      uVar22 = 1;
      if (-1 < iVar23) goto LAB_012e03ff;
LAB_012e043e:
      location = glu::CallLogWrapper::glGetUniformLocation
                           (this_00,programGL,queryName._M_dataplus._M_p);
      iVar8 = glu::getDataTypeScalarSize(str->type);
      uVar33 = 0;
      bVar21 = false;
      if (((this->super_CallLogWrapper).field_0x14 & 2) != 0) {
        bVar21 = uVar22 == 1 &&
                 (str->type - TYPE_INT < 0xfffffff7 && str->type - TYPE_DOUBLE < 0xfffffff7);
      }
      valuesToAssign.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      valuesToAssign.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      valuesToAssign.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar24 = extraout_RDX;
      if ((int)uVar22 < 1) {
        uVar22 = 0;
      }
      for (; pVVar7 = valuesToAssign.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ._M_impl.super__Vector_impl_data._M_start, uVar33 != uVar22;
          uVar33 = uVar33 + 1) {
        if (iVar23 < 0) {
          std::__cxx11::string::string((string *)&curName,(string *)str);
          pVVar18 = &str->finalValue;
LAB_012e05d6:
          pDVar27 = (DataType *)local_2a0;
          for (lVar16 = 0x11; lVar16 != 0; lVar16 = lVar16 + -1) {
            *pDVar27 = pVVar18->type;
            pVVar18 = (VarValue *)((long)pVVar18 + (ulong)bVar34 * -8 + 4);
            pDVar27 = pDVar27 + (ulong)bVar34 * -2 + 1;
          }
          if (local_2a0._0_4_ - TYPE_BOOL < 4) {
            uVar9 = glu::getDataTypeScalarSize(local_2a0._0_4_);
            DVar10 = scalarType;
            if (uVar9 != 1) {
              DVar10 = glu::getDataTypeVector(scalarType,uVar9);
            }
            apiValue.type = DVar10;
            if (scalarType == TYPE_UINT) {
              if ((int)uVar9 < 1) {
                uVar9 = 0;
              }
              for (uVar25 = 0; uVar9 != uVar25; uVar25 = uVar25 + 1) {
                iVar11 = 0;
                if (local_2a0[uVar25 + 4] == '\x01') {
                  dVar14 = deRandom_getUint32(&rnd->m_rnd);
                  iVar11 = dVar14 % 10 + 1;
                }
                *(int *)((long)&apiValue.val + uVar25 * 4) = iVar11;
              }
            }
            else if (scalarType == TYPE_INT) {
              if ((int)uVar9 < 1) {
                uVar9 = 0;
              }
              for (uVar25 = 0; uVar9 != uVar25; uVar25 = uVar25 + 1) {
                if (local_2a0[uVar25 + 4] == '\x01') {
                  dVar14 = deRandom_getUint32(&rnd->m_rnd);
                  *(uint *)((long)&apiValue.val + uVar25 * 4) =
                       (dVar14 % 0x15 - 10) + (uint)(dVar14 % 0x15 == 10);
                }
                else {
                  *(undefined4 *)((long)&apiValue.val + uVar25 * 4) = 0;
                }
              }
            }
            else if (scalarType == TYPE_FLOAT) {
              if ((int)uVar9 < 1) {
                uVar9 = 0;
              }
              for (uVar25 = 0; uVar9 != uVar25; uVar25 = uVar25 + 1) {
                if (local_2a0[uVar25 + 4] == '\x01') {
                  fVar35 = deRandom_getFloat(&rnd->m_rnd);
                  fVar35 = fVar35 * 20.0 + -10.0;
                  *(float *)((long)&apiValue.val + uVar25 * 4) = fVar35;
                  if ((fVar35 == 0.0) && (!NAN(fVar35))) {
                    *(undefined4 *)((long)&apiValue.val + uVar25 * 4) = 0x3f800000;
                  }
                }
                else {
                  *(undefined4 *)((long)&apiValue.val + uVar25 * 4) = 0;
                }
              }
            }
          }
          else if (local_2a0._0_4_ - TYPE_SAMPLER_1D < 0x1e) {
            apiValue.type = TYPE_INT;
            apiValue.val.floatV[0] = (float)local_2a0._4_4_;
          }
          else {
            pDVar27 = (DataType *)local_2a0;
            pVVar18 = &apiValue;
            for (lVar16 = 0x11; lVar16 != 0; lVar16 = lVar16 + -1) {
              pVVar18->type = *pDVar27;
              pDVar27 = pDVar27 + (ulong)bVar34 * -2 + 1;
              pVVar18 = (VarValue *)((long)pVVar18 + (ulong)bVar34 * -8 + 4);
            }
          }
          DVar10 = apiValue.type;
          if (apiValue.type - TYPE_INT < 0xfffffff7 && apiValue.type - TYPE_DOUBLE < 0xfffffff7 ||
              (uVar1 & 4) == 0) {
            pVVar18 = &apiValue;
            pVVar30 = &result_2;
            for (lVar16 = 0x11; lVar16 != 0; lVar16 = lVar16 + -1) {
              pVVar30->type = pVVar18->type;
              pVVar18 = (VarValue *)((long)pVVar18 + (ulong)bVar34 * -8 + 4);
              pVVar30 = (VarValue *)((long)pVVar30 + (ulong)bVar34 * -8 + 4);
            }
          }
          else {
            iVar11 = glu::getDataTypeMatrixNumRows(apiValue.type);
            uVar9 = glu::getDataTypeMatrixNumColumns(DVar10);
            iVar12 = glu::getDataTypeMatrixNumRows(DVar10);
            iVar13 = glu::getDataTypeMatrixNumColumns(DVar10);
            DVar10 = glu::getDataTypeMatrix(iVar12,iVar13);
            result_2.type = DVar10;
            iVar12 = 0;
            uVar25 = 0;
            if (0 < (int)uVar9) {
              uVar25 = (ulong)uVar9;
            }
            iVar13 = 0;
            if (0 < iVar11) {
              iVar13 = iVar11;
            }
            for (iVar26 = 0; uVar28 = uVar25, iVar5 = iVar26, iVar6 = iVar12, iVar26 != iVar13;
                iVar26 = iVar26 + 1) {
              while (uVar28 != 0) {
                *(undefined4 *)((long)&result_2.val + (long)iVar6 * 4) =
                     *(undefined4 *)((long)&apiValue.val + (long)iVar5 * 4);
                uVar28 = uVar28 - 1;
                iVar5 = iVar5 + iVar11;
                iVar6 = iVar6 + 1;
              }
              iVar12 = iVar12 + uVar9;
            }
          }
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
          ::push_back(&valuesToAssign,&result_2);
          if (str->type - TYPE_BOOL < 4) {
            result_2._0_8_ = pTVar2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(result_2.val.boolV + 4));
            std::operator<<((ostream *)(result_2.val.boolV + 4),"// Using type ");
            pcVar19 = glu::getDataTypeName(scalarType);
            std::operator<<((ostream *)((long)&result_2.val + 4),pcVar19);
            std::operator<<((ostream *)((long)&result_2.val + 4)," to set boolean value ");
            apiVarValueStr_abi_cxx11_((string *)&local_78,(Functional *)local_2a0,value);
            poVar29 = (ostringstream *)(result_2.val.boolV + 4);
            std::operator<<((ostream *)poVar29,(string *)&local_78);
            std::operator<<((ostream *)poVar29," for ");
            std::operator<<((ostream *)poVar29,(string *)&curName);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&result_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::ostringstream::~ostringstream(poVar29);
          }
          else if (str->type - TYPE_SAMPLER_1D < 0x1e) {
            poVar29 = (ostringstream *)(result_2.val.boolV + 4);
            result_2._0_8_ = pTVar2;
            std::__cxx11::ostringstream::ostringstream(poVar29);
            std::operator<<((ostream *)poVar29,"// Texture for the sampler uniform ");
            std::operator<<((ostream *)poVar29,(string *)&curName);
            std::operator<<((ostream *)poVar29," will be filled with color ");
            getSamplerFillValue(&local_78,&str->finalValue);
            apiVarValueStr_abi_cxx11_(&local_238,(Functional *)&local_78,value_00);
            std::operator<<((ostream *)((long)&result_2.val + 4),(string *)&local_238);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&result_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(result_2.val.boolV + 4));
          }
        }
        else {
          beforeLast((string *)&apiValue,&str->rootName,(char)uVar24);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &apiValue,"[");
          local_238._M_dataplus._M_p._0_4_ = str->elemNdx + uVar33;
          de::toString<int>((string *)&local_78,(int *)&local_238);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result_2,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_78);
          std::operator+(&curName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&result_2,"]");
          std::__cxx11::string::~string((string *)&result_2);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)local_2a0);
          std::__cxx11::string::~string((string *)&apiValue);
          cVar17 = BasicUniform::findWithName(basicUniforms,curName._M_dataplus._M_p);
          if (cVar17._M_current !=
              (basicUniforms->
              super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            pVVar18 = &(cVar17._M_current)->finalValue;
            goto LAB_012e05d6;
          }
        }
        std::__cxx11::string::~string((string *)&curName);
        uVar24 = extraout_RDX_00;
      }
      DVar10 = (valuesToAssign.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                ._M_impl.super__Vector_impl_data._M_start)->type;
      lVar16 = (long)iVar8;
      if (DVar10 - TYPE_FLOAT < 4) {
        if (bVar21) {
          switch(iVar8) {
          case 1:
            glu::CallLogWrapper::glProgramUniform1f
                      (this_00,programGL,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0]);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x58c;
            pcVar19 = "glProgramUniform1f(programGL, location, ptr[0])";
            break;
          case 2:
            glu::CallLogWrapper::glProgramUniform2f
                      (this_00,programGL,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1]);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x58d;
            pcVar19 = "glProgramUniform2f(programGL, location, ptr[0], ptr[1])";
            break;
          case 3:
            glu::CallLogWrapper::glProgramUniform3f
                      (this_00,programGL,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[2]);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x58e;
            pcVar19 = "glProgramUniform3f(programGL, location, ptr[0], ptr[1], ptr[2])";
            break;
          case 4:
            glu::CallLogWrapper::glProgramUniform4f
                      (this_00,programGL,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[2],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[3]);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x58f;
            pcVar19 = "glProgramUniform4f(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3])";
            break;
          default:
            goto switchD_012e0a59_default;
          }
          glu::checkError(dVar14,pcVar19,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,iVar23);
          goto switchD_012e0a59_default;
        }
        lVar20 = ((long)valuesToAssign.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)valuesToAssign.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x44;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&result_2,lVar16 * lVar20,
                   (allocator_type *)local_2a0);
        uVar25 = (ulong)(result_2.val._4_8_ - result_2._0_8_) >> 2;
        uVar28 = uVar25 & 0xffffffff;
        if ((int)uVar25 < 1) {
          uVar28 = 0;
        }
        for (uVar25 = 0; uVar28 != uVar25; uVar25 = uVar25 + 1) {
          uVar4 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff;
          *(float *)(result_2._0_8_ + uVar25 * 4) =
               pVVar7[(int)((long)uVar4 / (long)iVar8)].val.floatV
               [(long)uVar4 % (long)iVar8 & 0xffffffff];
        }
        GVar32 = (GLsizei)lVar20;
        switch(iVar8) {
        case 1:
          glu::CallLogWrapper::glProgramUniform1fv
                    (this_00,programGL,location,GVar32,(GLfloat *)result_2._0_8_);
          dVar14 = glu::CallLogWrapper::glGetError(this_00);
          iVar23 = 0x59d;
          pcVar19 = 
          "glProgramUniform1fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        case 2:
          glu::CallLogWrapper::glProgramUniform2fv
                    (this_00,programGL,location,GVar32,(GLfloat *)result_2._0_8_);
          dVar14 = glu::CallLogWrapper::glGetError(this_00);
          iVar23 = 0x59e;
          pcVar19 = 
          "glProgramUniform2fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        case 3:
          glu::CallLogWrapper::glProgramUniform3fv
                    (this_00,programGL,location,GVar32,(GLfloat *)result_2._0_8_);
          dVar14 = glu::CallLogWrapper::glGetError(this_00);
          iVar23 = 0x59f;
          pcVar19 = 
          "glProgramUniform3fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        case 4:
          glu::CallLogWrapper::glProgramUniform4fv
                    (this_00,programGL,location,GVar32,(GLfloat *)result_2._0_8_);
          dVar14 = glu::CallLogWrapper::glGetError(this_00);
          iVar23 = 0x5a0;
          pcVar19 = 
          "glProgramUniform4fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        default:
          goto switchD_012e0cd8_default;
        }
        glu::checkError(dVar14,pcVar19,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                        ,iVar23);
switchD_012e0cd8_default:
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&result_2);
      }
      else {
        if (DVar10 - TYPE_FLOAT_MAT2 < 9 || DVar10 - TYPE_DOUBLE_MAT2 < 9) {
          lVar20 = ((long)valuesToAssign.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x44;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&result_2,lVar16 * lVar20,
                     (allocator_type *)local_2a0);
          uVar25 = (ulong)(result_2.val._4_8_ - result_2._0_8_) >> 2;
          uVar28 = uVar25 & 0xffffffff;
          if ((int)uVar25 < 1) {
            uVar28 = 0;
          }
          for (uVar25 = 0; uVar28 != uVar25; uVar25 = uVar25 + 1) {
            uVar4 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff;
            *(float *)(result_2._0_8_ + uVar25 * 4) =
                 pVVar7[(int)((long)uVar4 / (long)iVar8)].val.floatV
                 [(long)uVar4 % (long)iVar8 & 0xffffffff];
          }
          local_328 = (GLboolean)((uVar1 & 4) >> 2);
          GVar32 = (GLsizei)lVar20;
          switch(str->type) {
          case TYPE_FLOAT_MAT2:
            glu::CallLogWrapper::glProgramUniformMatrix2fv
                      (this_00,programGL,location,GVar32,local_328,(GLfloat *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5b1;
            pcVar19 = 
            "glProgramUniformMatrix2fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
            ;
            break;
          case TYPE_FLOAT_MAT2X3:
            glu::CallLogWrapper::glProgramUniformMatrix2x3fv
                      (this_00,programGL,location,GVar32,local_328,(GLfloat *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5b4;
            pcVar19 = 
            "glProgramUniformMatrix2x3fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
            ;
            break;
          case TYPE_FLOAT_MAT2X4:
            glu::CallLogWrapper::glProgramUniformMatrix2x4fv
                      (this_00,programGL,location,GVar32,local_328,(GLfloat *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5b5;
            pcVar19 = 
            "glProgramUniformMatrix2x4fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
            ;
            break;
          case TYPE_FLOAT_MAT3X2:
            glu::CallLogWrapper::glProgramUniformMatrix3x2fv
                      (this_00,programGL,location,GVar32,local_328,(GLfloat *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5b6;
            pcVar19 = 
            "glProgramUniformMatrix3x2fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
            ;
            break;
          case TYPE_FLOAT_MAT3:
            glu::CallLogWrapper::glProgramUniformMatrix3fv
                      (this_00,programGL,location,GVar32,local_328,(GLfloat *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5b2;
            pcVar19 = 
            "glProgramUniformMatrix3fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
            ;
            break;
          case TYPE_FLOAT_MAT3X4:
            glu::CallLogWrapper::glProgramUniformMatrix3x4fv
                      (this_00,programGL,location,GVar32,local_328,(GLfloat *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5b7;
            pcVar19 = 
            "glProgramUniformMatrix3x4fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
            ;
            break;
          case TYPE_FLOAT_MAT4X2:
            glu::CallLogWrapper::glProgramUniformMatrix4x2fv
                      (this_00,programGL,location,GVar32,local_328,(GLfloat *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5b8;
            pcVar19 = 
            "glProgramUniformMatrix4x2fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
            ;
            break;
          case TYPE_FLOAT_MAT4X3:
            glu::CallLogWrapper::glProgramUniformMatrix4x3fv
                      (this_00,programGL,location,GVar32,local_328,(GLfloat *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5b9;
            pcVar19 = 
            "glProgramUniformMatrix4x3fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
            ;
            break;
          case TYPE_FLOAT_MAT4:
            glu::CallLogWrapper::glProgramUniformMatrix4fv
                      (this_00,programGL,location,GVar32,local_328,(GLfloat *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5b3;
            pcVar19 = 
            "glProgramUniformMatrix4fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
            ;
            break;
          default:
            goto switchD_012e0cd8_default;
          }
          glu::checkError(dVar14,pcVar19,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,iVar23);
          goto switchD_012e0cd8_default;
        }
        if (3 < DVar10 - TYPE_INT) {
          if (3 < DVar10 - TYPE_UINT) {
            if (DVar10 - TYPE_SAMPLER_1D < 0x1e) {
              if (bVar21) {
                glu::CallLogWrapper::glProgramUniform1i
                          (this_00,programGL,location,(str->finalValue).val.intV[0]);
                GVar15 = glu::CallLogWrapper::glGetError(this_00);
                glu::checkError(GVar15,
                                "glProgramUniform1i(programGL, location, uniform.finalValue.val.samplerV.unit)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                ,0x605);
              }
              else {
                result_2.type = (str->finalValue).val.intV[0];
                glu::CallLogWrapper::glProgramUniform1iv
                          (this_00,programGL,location,
                           (GLsizei)(((long)valuesToAssign.
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)valuesToAssign.
                                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                           ._M_impl.super__Vector_impl_data._M_start) / 0x44),
                           (GLint *)&result_2);
                GVar15 = glu::CallLogWrapper::glGetError(this_00);
                glu::checkError(GVar15,
                                "glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &unit)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                ,0x609);
              }
            }
            goto switchD_012e0a59_default;
          }
          if (bVar21) {
            switch(iVar8) {
            case 1:
              glu::CallLogWrapper::glProgramUniform1ui
                        (this_00,programGL,location,
                         ((valuesToAssign.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[0]);
              dVar14 = glu::CallLogWrapper::glGetError(this_00);
              iVar23 = 0x5e8;
              pcVar19 = "glProgramUniform1ui(programGL, location, ptr[0])";
              break;
            case 2:
              glu::CallLogWrapper::glProgramUniform2ui
                        (this_00,programGL,location,
                         ((valuesToAssign.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[0],
                         ((valuesToAssign.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[1]);
              dVar14 = glu::CallLogWrapper::glGetError(this_00);
              iVar23 = 0x5e9;
              pcVar19 = "glProgramUniform2ui(programGL, location, ptr[0], ptr[1])";
              break;
            case 3:
              glu::CallLogWrapper::glProgramUniform3ui
                        (this_00,programGL,location,
                         ((valuesToAssign.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[0],
                         ((valuesToAssign.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[1],
                         ((valuesToAssign.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[2]);
              dVar14 = glu::CallLogWrapper::glGetError(this_00);
              iVar23 = 0x5ea;
              pcVar19 = "glProgramUniform3ui(programGL, location, ptr[0], ptr[1], ptr[2])";
              break;
            case 4:
              glu::CallLogWrapper::glProgramUniform4ui
                        (this_00,programGL,location,
                         ((valuesToAssign.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[0],
                         ((valuesToAssign.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[1],
                         ((valuesToAssign.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[2],
                         ((valuesToAssign.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[3]);
              dVar14 = glu::CallLogWrapper::glGetError(this_00);
              iVar23 = 0x5eb;
              pcVar19 = "glProgramUniform4ui(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3])";
              break;
            default:
              goto switchD_012e0a59_default;
            }
            glu::checkError(dVar14,pcVar19,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                            ,iVar23);
            goto switchD_012e0a59_default;
          }
          lVar20 = ((long)valuesToAssign.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x44;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&result_2,
                     lVar16 * lVar20,(allocator_type *)local_2a0);
          uVar25 = (ulong)(result_2.val._4_8_ - result_2._0_8_) >> 2;
          uVar28 = uVar25 & 0xffffffff;
          if ((int)uVar25 < 1) {
            uVar28 = 0;
          }
          for (uVar25 = 0; uVar28 != uVar25; uVar25 = uVar25 + 1) {
            uVar4 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff;
            *(float *)(result_2._0_8_ + uVar25 * 4) =
                 pVVar7[(int)((long)uVar4 / (long)iVar8)].val.floatV
                 [(long)uVar4 % (long)iVar8 & 0xffffffff];
          }
          GVar32 = (GLsizei)lVar20;
          switch(iVar8) {
          case 1:
            glu::CallLogWrapper::glProgramUniform1uiv
                      (this_00,programGL,location,GVar32,(GLuint *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5f9;
            pcVar19 = 
            "glProgramUniform1uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 2:
            glu::CallLogWrapper::glProgramUniform2uiv
                      (this_00,programGL,location,GVar32,(GLuint *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5fa;
            pcVar19 = 
            "glProgramUniform2uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 3:
            glu::CallLogWrapper::glProgramUniform3uiv
                      (this_00,programGL,location,GVar32,(GLuint *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5fb;
            pcVar19 = 
            "glProgramUniform3uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 4:
            glu::CallLogWrapper::glProgramUniform4uiv
                      (this_00,programGL,location,GVar32,(GLuint *)result_2._0_8_);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5fc;
            pcVar19 = 
            "glProgramUniform4uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          default:
            goto switchD_012e106b_default;
          }
          glu::checkError(dVar14,pcVar19,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,iVar23);
switchD_012e106b_default:
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&result_2);
          goto switchD_012e0a59_default;
        }
        if (bVar21) {
          switch(iVar8) {
          case 1:
            glu::CallLogWrapper::glProgramUniform1i
                      (this_00,programGL,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[0]);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5c6;
            pcVar19 = "glProgramUniform1i(programGL, location, ptr[0])";
            break;
          case 2:
            glu::CallLogWrapper::glProgramUniform2i
                      (this_00,programGL,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[1]);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5c7;
            pcVar19 = "glProgramUniform2i(programGL, location, ptr[0], ptr[1])";
            break;
          case 3:
            glu::CallLogWrapper::glProgramUniform3i
                      (this_00,programGL,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[1],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[2]);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5c8;
            pcVar19 = "glProgramUniform3i(programGL, location, ptr[0], ptr[1], ptr[2])";
            break;
          case 4:
            glu::CallLogWrapper::glProgramUniform4i
                      (this_00,programGL,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[1],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[2],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[3]);
            dVar14 = glu::CallLogWrapper::glGetError(this_00);
            iVar23 = 0x5c9;
            pcVar19 = "glProgramUniform4i(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3])";
            break;
          default:
            goto switchD_012e0a59_default;
          }
          glu::checkError(dVar14,pcVar19,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,iVar23);
          goto switchD_012e0a59_default;
        }
        lVar20 = ((long)valuesToAssign.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)valuesToAssign.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x44;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&result_2,lVar16 * lVar20,
                   (allocator_type *)local_2a0);
        uVar25 = (ulong)(result_2.val._4_8_ - result_2._0_8_) >> 2;
        uVar28 = uVar25 & 0xffffffff;
        if ((int)uVar25 < 1) {
          uVar28 = 0;
        }
        for (uVar25 = 0; uVar28 != uVar25; uVar25 = uVar25 + 1) {
          uVar4 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff;
          *(float *)(result_2._0_8_ + uVar25 * 4) =
               pVVar7[(int)((long)uVar4 / (long)iVar8)].val.floatV
               [(long)uVar4 % (long)iVar8 & 0xffffffff];
        }
        GVar32 = (GLsizei)lVar20;
        switch(iVar8) {
        case 1:
          glu::CallLogWrapper::glProgramUniform1iv
                    (this_00,programGL,location,GVar32,(GLint *)result_2._0_8_);
          dVar14 = glu::CallLogWrapper::glGetError(this_00);
          iVar23 = 0x5d7;
          pcVar19 = 
          "glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        case 2:
          glu::CallLogWrapper::glProgramUniform2iv
                    (this_00,programGL,location,GVar32,(GLint *)result_2._0_8_);
          dVar14 = glu::CallLogWrapper::glGetError(this_00);
          iVar23 = 0x5d8;
          pcVar19 = 
          "glProgramUniform2iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        case 3:
          glu::CallLogWrapper::glProgramUniform3iv
                    (this_00,programGL,location,GVar32,(GLint *)result_2._0_8_);
          dVar14 = glu::CallLogWrapper::glGetError(this_00);
          iVar23 = 0x5d9;
          pcVar19 = 
          "glProgramUniform3iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        case 4:
          glu::CallLogWrapper::glProgramUniform4iv
                    (this_00,programGL,location,GVar32,(GLint *)result_2._0_8_);
          dVar14 = glu::CallLogWrapper::glGetError(this_00);
          iVar23 = 0x5da;
          pcVar19 = 
          "glProgramUniform4iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        default:
          goto switchD_012e0e56_default;
        }
        glu::checkError(dVar14,pcVar19,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                        ,iVar23);
switchD_012e0e56_default:
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&result_2);
      }
switchD_012e0a59_default:
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
      ::~vector(&valuesToAssign);
    }
    else {
      beforeLast(&queryName,&str->name,(char)(lVar16 % 0x98));
LAB_012e03ff:
      poVar29 = (ostringstream *)(result_2.val.boolV + 4);
      uVar33 = *(uint *)&(this->super_CallLogWrapper).field_0x14;
      if ((uVar33 & 8) == 0) {
        uVar22 = 1;
        if ((uVar33 & 0x10) != 0) {
          uVar22 = ~str->elemNdx * 2 & 2;
          goto LAB_012e0436;
        }
        goto LAB_012e043e;
      }
      if (str->elemNdx == 0) {
        uVar22 = str->rootSize;
LAB_012e0436:
        if (uVar22 != 0) goto LAB_012e043e;
      }
      result_2._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar29);
      std::operator<<((ostream *)poVar29,"// Uniform ");
      std::operator<<((ostream *)poVar29,(string *)str);
      std::operator<<((ostream *)poVar29,
                      " is covered by another glProgramUniform*v() call to the same array");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&result_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar29);
    }
    std::__cxx11::string::~string((string *)&queryName);
    lVar31 = lVar31 + 1;
  } while( true );
}

Assistant:

void UniformCase::assignUniforms (const vector<BasicUniform>& basicUniforms, deUint32 programGL, Random& rnd)
{
	TestLog&				log				= m_testCtx.getLog();
	const bool				transpose		= (m_features & FEATURE_MATRIXMODE_ROWMAJOR) != 0;
	const GLboolean			transposeGL		= transpose ? GL_TRUE : GL_FALSE;
	const glu::DataType		boolApiType		= m_features & FEATURE_BOOLEANAPITYPE_INT	? glu::TYPE_INT
											: m_features & FEATURE_BOOLEANAPITYPE_UINT	? glu::TYPE_UINT
											:											  glu::TYPE_FLOAT;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform				= basicUniforms[unifNdx];
		const bool				isArrayMember		= uniform.elemNdx >= 0;
		const string			queryName			= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				numValuesToAssign	= !isArrayMember									? 1
													: m_features & FEATURE_ARRAYASSIGN_FULL				? (uniform.elemNdx == 0			? uniform.rootSize	: 0)
													: m_features & FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO	? (uniform.elemNdx % 2 == 0		? 2					: 0)
													: /* Default: assign array elements separately */	  1;

		DE_ASSERT(numValuesToAssign >= 0);
		DE_ASSERT(numValuesToAssign == 1 || isArrayMember);

		if (numValuesToAssign == 0)
		{
			log << TestLog::Message << "// Uniform " << uniform.name << " is covered by another glProgramUniform*v() call to the same array" << TestLog::EndMessage;
			continue;
		}

		const int			location			= glGetUniformLocation(programGL, queryName.c_str());
		const int			typeSize			= glu::getDataTypeScalarSize(uniform.type);
		const bool			assignByValue		= m_features & FEATURE_UNIFORMFUNC_VALUE && !glu::isDataTypeMatrix(uniform.type) && numValuesToAssign == 1;
		vector<VarValue>	valuesToAssign;

		for (int i = 0; i < numValuesToAssign; i++)
		{
			const string	curName = isArrayMember ? beforeLast(uniform.rootName, '[') + "[" + de::toString(uniform.elemNdx+i) + "]" : uniform.name;
			VarValue		unifValue;

			if (isArrayMember)
			{
				const vector<BasicUniform>::const_iterator elemUnif = BasicUniform::findWithName(basicUniforms, curName.c_str());
				if (elemUnif == basicUniforms.end())
					continue;
				unifValue = elemUnif->finalValue;
			}
			else
				unifValue = uniform.finalValue;

			const VarValue apiValue = glu::isDataTypeBoolOrBVec(unifValue.type)	? getRandomBoolRepresentation(unifValue, boolApiType, rnd)
									: glu::isDataTypeSampler(unifValue.type)	? getSamplerUnitValue(unifValue)
									: unifValue;

			valuesToAssign.push_back(glu::isDataTypeMatrix(apiValue.type) && transpose ? getTransposeMatrix(apiValue) : apiValue);

			if (glu::isDataTypeBoolOrBVec(uniform.type))
				log << TestLog::Message << "// Using type " << glu::getDataTypeName(boolApiType) << " to set boolean value " << apiVarValueStr(unifValue) << " for " << curName << TestLog::EndMessage;
			else if (glu::isDataTypeSampler(uniform.type))
				log << TestLog::Message << "// Texture for the sampler uniform " << curName << " will be filled with color " << apiVarValueStr(getSamplerFillValue(uniform.finalValue)) << TestLog::EndMessage;
		}

		DE_ASSERT(!valuesToAssign.empty());

		if (glu::isDataTypeFloatOrVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const float* const ptr = &valuesToAssign[0].val.floatV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1f(programGL, location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glProgramUniform2f(programGL, location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glProgramUniform3f(programGL, location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glProgramUniform4f(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<float> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glProgramUniform2fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glProgramUniform3fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glProgramUniform4fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeMatrix(valuesToAssign[0].type))
		{
			DE_ASSERT(!assignByValue);

			vector<float> buffer(valuesToAssign.size() * typeSize);
			for (int i = 0; i < (int)buffer.size(); i++)
				buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

			DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(buffer[0]));
			switch (uniform.type)
			{
				case glu::TYPE_FLOAT_MAT2:		GLU_CHECK_CALL(glProgramUniformMatrix2fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3:		GLU_CHECK_CALL(glProgramUniformMatrix3fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4:		GLU_CHECK_CALL(glProgramUniformMatrix4fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT2X3:	GLU_CHECK_CALL(glProgramUniformMatrix2x3fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT2X4:	GLU_CHECK_CALL(glProgramUniformMatrix2x4fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3X2:	GLU_CHECK_CALL(glProgramUniformMatrix3x2fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3X4:	GLU_CHECK_CALL(glProgramUniformMatrix3x4fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4X2:	GLU_CHECK_CALL(glProgramUniformMatrix4x2fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4X3:	GLU_CHECK_CALL(glProgramUniformMatrix4x3fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				default:
					DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeIntOrIVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const deInt32* const ptr = &valuesToAssign[0].val.intV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1i(programGL, location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glProgramUniform2i(programGL, location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glProgramUniform3i(programGL, location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glProgramUniform4i(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<deInt32> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.intV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLint) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glProgramUniform2iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glProgramUniform3iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glProgramUniform4iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeUintOrUVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const deUint32* const ptr = &valuesToAssign[0].val.uintV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1ui(programGL, location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glProgramUniform2ui(programGL, location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glProgramUniform3ui(programGL, location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glProgramUniform4ui(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<deUint32> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.intV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLuint) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glProgramUniform2uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glProgramUniform3uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glProgramUniform4uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeSampler(valuesToAssign[0].type))
		{
			if (assignByValue)
				GLU_CHECK_CALL(glProgramUniform1i(programGL, location, uniform.finalValue.val.samplerV.unit));
			else
			{
				const GLint unit = uniform.finalValue.val.samplerV.unit;
				GLU_CHECK_CALL(glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &unit));
			}
		}
		else
			DE_ASSERT(false);
	}
}